

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_u8x4.c
# Opt level: O2

image_u8x4_t * image_u8x4_create_from_pam(char *inpath)

{
  uint8_t *puVar1;
  pam_t *pam;
  image_u8x4_t *piVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  int x;
  int iVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  
  pam = pam_create_from_file(inpath);
  iVar10 = 0;
  if (pam == (pam_t *)0x0) {
    piVar2 = (image_u8x4_t *)0x0;
  }
  else {
    piVar2 = image_u8x4_create(pam->width,pam->height);
    for (iVar7 = 0; iVar7 < pam->height; iVar7 = iVar7 + 1) {
      iVar4 = pam->depth;
      lVar8 = (long)iVar7;
      if (iVar4 == 4) {
        lVar3 = (long)pam->width * 4;
        memcpy(piVar2->buf + piVar2->stride * lVar8,pam->data + lVar8 * lVar3,(long)(int)lVar3);
      }
      else if (iVar4 == 3) {
        iVar4 = 0;
        iVar5 = 0;
        for (iVar6 = 0; iVar6 < pam->width; iVar6 = iVar6 + 1) {
          puVar1 = piVar2->buf;
          lVar8 = (long)(piVar2->stride * iVar7 + iVar5);
          puVar1[lVar8] = pam->data[pam->width * iVar10 + iVar4];
          puVar1[lVar8 + 1] = pam->data[(long)(pam->width * iVar10 + iVar4) + 1];
          puVar1[lVar8 + 2] = pam->data[(long)(pam->width * iVar10 + iVar4) + 2];
          puVar1[lVar8 + 3] = 0xff;
          iVar5 = iVar5 + 4;
          iVar4 = iVar4 + 3;
        }
      }
      else {
        if (iVar4 != 1) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/image_u8x4.c"
                        ,0x70,"image_u8x4_t *image_u8x4_create_from_pam(const char *)");
        }
        lVar3 = 0;
        iVar4 = 0;
        while( true ) {
          if (pam->width <= (int)lVar3) break;
          puVar1 = piVar2->buf;
          lVar9 = (long)(piVar2->stride * iVar7 + iVar4);
          puVar1[lVar9] = pam->data[pam->width * iVar7 + (int)lVar3];
          puVar1[lVar9 + 1] = pam->data[lVar3 + pam->width * lVar8];
          puVar1[lVar9 + 2] = pam->data[lVar3 + pam->width * lVar8];
          puVar1[lVar9 + 3] = 0xff;
          iVar4 = iVar4 + 4;
          lVar3 = lVar3 + 1;
        }
      }
      iVar10 = iVar10 + 3;
    }
    pam_destroy(pam);
  }
  return piVar2;
}

Assistant:

image_u8x4_t *image_u8x4_create_from_pam(const char *inpath)
{
    pam_t *pam = pam_create_from_file(inpath);
    if (!pam)
        return NULL;

    image_u8x4_t *im = image_u8x4_create(pam->width, pam->height);

    for (int y = 0; y < pam->height; y++) {
        if (pam->depth == 1) {
            for (int x = 0; x < pam->width; x++) {
                im->buf[y*im->stride + 4*x + 0] = pam->data[pam->width*y + x + 0];
                im->buf[y*im->stride + 4*x + 1] = pam->data[pam->width*y + x + 0];
                im->buf[y*im->stride + 4*x + 2] = pam->data[pam->width*y + x + 0];
                im->buf[y*im->stride + 4*x + 3] = 255;
            }
        } else if (pam->depth == 3) {
            for (int x = 0; x < pam->width; x++) {
                im->buf[y*im->stride + 4*x + 0] = pam->data[3*pam->width*y + 3*x + 0];
                im->buf[y*im->stride + 4*x + 1] = pam->data[3*pam->width*y + 3*x + 1];
                im->buf[y*im->stride + 4*x + 2] = pam->data[3*pam->width*y + 3*x + 2];
                im->buf[y*im->stride + 4*x + 3] = 255;
            }
        } else if (pam->depth == 4) {
            memcpy(&im->buf[y*im->stride], &pam->data[4*pam->width*y], 4*pam->width);
        } else {
            assert(0); // not implemented
        }
    }

    pam_destroy(pam);
    return im;
}